

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O2

cl_mem __thiscall
xmrig::OclSharedData::createBuffer
          (OclSharedData *this,cl_context context,size_t size,size_t *offset)

{
  cl_mem p_Var1;
  size_t sVar2;
  ulong uVar3;
  
  std::mutex::lock(&this->m_mutex);
  sVar2 = this->m_offset;
  this->m_offset = sVar2 + 1;
  *offset = *offset + sVar2 * size;
  p_Var1 = this->m_buffer;
  if (p_Var1 == (cl_mem)0x0) {
    uVar3 = size * this->m_threads;
    sVar2 = 0x40000000;
    if (0x40000000 < uVar3) {
      sVar2 = uVar3;
    }
    p_Var1 = OclLib::createBuffer(context,1,sVar2,(void *)0x0);
    this->m_buffer = p_Var1;
  }
  p_Var1 = OclLib::retain(p_Var1);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return p_Var1;
}

Assistant:

cl_mem xmrig::OclSharedData::createBuffer(cl_context context, size_t size, size_t &offset)
{
    std::lock_guard<std::mutex> lock(m_mutex);

    offset += size * m_offset++;
    size   = std::max(size * m_threads, oneGiB);

    if (!m_buffer) {
        m_buffer = OclLib::createBuffer(context, CL_MEM_READ_WRITE, size);
    }

    return OclLib::retain(m_buffer);
}